

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

ZoneState * QLocalTime::mapLocalTime(qint64 local,TransitionOptions resolve)

{
  bool bVar1;
  DaylightStatus d;
  qint64 in_RSI;
  ZoneState *in_RDI;
  long in_FS_OFFSET;
  qint64 unaff_retaddr;
  int offset;
  DaylightStatus dst;
  qint64 millis;
  qint64 localSecs;
  qint64 revised;
  MkTimeResult use;
  TransitionOptions in_stack_000000dc;
  ZoneState *millis_00;
  undefined1 local_50 [32];
  int local_30;
  int local_28;
  byte local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  millis_00 = in_RDI;
  memset(local_50,0xaa,0x48);
  anon_unknown.dwarf_4963d8::resolveLocalTime(unaff_retaddr,in_stack_000000dc);
  if ((local_10 & 1) == 0) {
    QDateTimePrivate::ZoneState::ZoneState(in_RDI,in_RSI);
  }
  else {
    d = (DaylightStatus)(0 < local_30);
    bVar1 = anon_unknown.dwarf_4963d8::secondsAndMillisOverflow
                      ((ulong)CONCAT14(0 < local_30,local_28),(qint64)millis_00,&in_RDI->when);
    if (bVar1) {
      QDateTimePrivate::ZoneState::ZoneState(in_RDI,in_RSI,local_28,UnknownDaylightTime,false);
    }
    else {
      QDateTimePrivate::ZoneState::ZoneState(in_RDI,-0x5555555555555556,local_28,d,true);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return millis_00;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState mapLocalTime(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    // Revised later to match what use.local tells us:
    qint64 localSecs = local / MSECS_PER_SEC;
    auto use = resolveLocalTime(localSecs, resolve);
    if (!use.good)
        return {local};

    qint64 millis = local - localSecs * MSECS_PER_SEC;
    // Division is defined to round towards zero:
    Q_ASSERT(local < 0 ? (millis <= 0 && millis > -MSECS_PER_SEC)
                       : (millis >= 0 && millis < MSECS_PER_SEC));

    QDateTimePrivate::DaylightStatus dst =
        use.local.tm_isdst > 0 ? QDateTimePrivate::DaylightTime : QDateTimePrivate::StandardTime;

#ifdef HAVE_TM_GMTOFF
    const int offset = use.local.tm_gmtoff;
    localSecs = offset + use.utcSecs;
#else
    // Provisional offset, until we have a revised localSecs:
    int offset = localSecs - use.utcSecs;
    auto jd = tmToJd(use.local);
    if (Q_UNLIKELY(!jd))
        return {local, offset, dst, false};

    qint64 daySecs = tmSecsWithinDay(use.local);
    Q_ASSERT(0 <= daySecs && daySecs < SECS_PER_DAY);
    if (daySecs > 0 && *jd < JULIAN_DAY_FOR_EPOCH) {
        jd = *jd + 1;
        daySecs -= SECS_PER_DAY;
    }
    if (Q_UNLIKELY(daysAndSecondsOverflow(*jd, daySecs, &localSecs)))
        return {local, offset, dst, false};

    // Use revised localSecs to refine offset:
    offset = localSecs - use.utcSecs;
#endif // HAVE_TM_GMTOFF

    // The only way localSecs and millis can now have opposite sign is for
    // resolution of the local time to have kicked us across the epoch, in which
    // case there's no danger of overflow. So if overflow is in danger of
    // happening, we're already doing the best we can to avoid it.
    qint64 revised;
    if (secondsAndMillisOverflow(localSecs, millis, &revised))
        return {local, offset, QDateTimePrivate::UnknownDaylightTime, false};
    return {revised, offset, dst, true};
}